

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeIntegerValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  int32_t *piVar6;
  size_t sVar7;
  int64_t iVar8;
  pointer pPVar9;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *pIVar10;
  DecoderBuffer *in_RDX;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  long *in_RDI;
  size_t i;
  uint8_t num_bytes;
  SequentialIntegerAttributeDecoder *in_stack_00000040;
  uint8_t compressed;
  int32_t *portable_attribute_data;
  size_t num_values;
  size_t num_entries;
  int num_components;
  uint32_t *in_stack_ffffffffffffff78;
  DecoderBuffer *in_stack_ffffffffffffff80;
  DecoderBuffer *in_stack_ffffffffffffff88;
  int in_values;
  uint32_t *in_stack_ffffffffffffff90;
  int32_t *piVar11;
  ulong local_50;
  byte local_42;
  char local_41;
  
  uVar2 = (**(code **)(*in_RDI + 0x58))();
  if ((int)uVar2 < 1) {
    return false;
  }
  sVar4 = std::
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          ::size(in_RSI);
  uVar5 = sVar4 * (long)(int)uVar2;
  PreparePortableAttribute(in_stack_00000040,i._4_4_,(int)i);
  piVar6 = GetPortableAttributeData((SequentialIntegerAttributeDecoder *)in_stack_ffffffffffffff88);
  if (piVar6 == (int32_t *)0x0) {
    return false;
  }
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80);
  if (!bVar1) {
    return false;
  }
  if (local_41 == '\0') {
    bVar1 = DecoderBuffer::Decode<unsigned_char>
                      (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80);
    if (!bVar1) {
      return false;
    }
    uVar3 = DataTypeLength(DT_INT32);
    if (local_42 == uVar3) {
      SequentialAttributeDecoder::portable_attribute((SequentialAttributeDecoder *)0x1e042a);
      PointAttribute::buffer((PointAttribute *)0x1e0432);
      sVar7 = DataBuffer::data_size((DataBuffer *)0x1e043a);
      if (sVar7 < uVar5 * 4) {
        return false;
      }
      bVar1 = DecoderBuffer::Decode
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         (size_t)in_stack_ffffffffffffff78);
      if (!bVar1) {
        return false;
      }
    }
    else {
      SequentialAttributeDecoder::portable_attribute((SequentialAttributeDecoder *)0x1e048d);
      PointAttribute::buffer((PointAttribute *)0x1e0495);
      sVar7 = DataBuffer::data_size((DataBuffer *)0x1e049d);
      if (sVar7 < local_42 * uVar5) {
        return false;
      }
      iVar8 = DecoderBuffer::remaining_size(in_RDX);
      if (iVar8 < (long)(local_42 * uVar5)) {
        return false;
      }
      for (local_50 = 0; local_50 < uVar5; local_50 = local_50 + 1) {
        bVar1 = DecoderBuffer::Decode
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           (size_t)in_stack_ffffffffffffff78);
        if (!bVar1) {
          return false;
        }
      }
    }
    in_values = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  }
  else {
    bVar1 = DecodeSymbols((uint32_t)in_stack_ffffffffffffff90,
                          (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    in_values = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if (!bVar1) {
      return false;
    }
  }
  if (uVar5 != 0) {
    bVar1 = std::operator==((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                             *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      pPVar9 = std::
               unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               ::operator->((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                             *)0x1e056b);
      uVar3 = (*(pPVar9->super_PredictionSchemeDecoderInterface).super_PredictionSchemeInterface.
                _vptr_PredictionSchemeInterface[8])();
      if ((uVar3 & 1) != 0) goto LAB_001e058e;
    }
    ConvertSymbolsToSignedInts
              (in_stack_ffffffffffffff90,in_values,(int32_t *)in_stack_ffffffffffffff80);
  }
LAB_001e058e:
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      *)0x1e059c);
  if (bVar1) {
    pPVar9 = std::
             unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
             ::operator->((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                           *)0x1e05b3);
    uVar3 = (*(pPVar9->super_PredictionSchemeDecoderInterface).super_PredictionSchemeInterface.
              _vptr_PredictionSchemeInterface[10])(pPVar9,in_RDX);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    if (uVar5 != 0) {
      pPVar9 = std::
               unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               ::operator->((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                             *)0x1e05e8);
      piVar11 = piVar6;
      pIVar10 = std::
                vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                ::data((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                        *)0x1e061c);
      uVar2 = (*(pPVar9->super_PredictionSchemeDecoderInterface).super_PredictionSchemeInterface.
                _vptr_PredictionSchemeInterface[0xb])
                        (pPVar9,piVar6,piVar11,uVar5 & 0xffffffff,(ulong)uVar2,pIVar10);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int num_components = GetNumValueComponents();
  if (num_components <= 0) {
    return false;
  }
  const size_t num_entries = point_ids.size();
  const size_t num_values = num_entries * num_components;
  PreparePortableAttribute(static_cast<int>(num_entries), num_components);
  int32_t *const portable_attribute_data = GetPortableAttributeData();
  if (portable_attribute_data == nullptr) {
    return false;
  }
  uint8_t compressed;
  if (!in_buffer->Decode(&compressed)) {
    return false;
  }
  if (compressed > 0) {
    // Decode compressed values.
    if (!DecodeSymbols(static_cast<uint32_t>(num_values), num_components,
                       in_buffer,
                       reinterpret_cast<uint32_t *>(portable_attribute_data))) {
      return false;
    }
  } else {
    // Decode the integer data directly.
    // Get the number of bytes for a given entry.
    uint8_t num_bytes;
    if (!in_buffer->Decode(&num_bytes)) {
      return false;
    }
    if (num_bytes == DataTypeLength(DT_INT32)) {
      if (portable_attribute()->buffer()->data_size() <
          sizeof(int32_t) * num_values) {
        return false;
      }
      if (!in_buffer->Decode(portable_attribute_data,
                             sizeof(int32_t) * num_values)) {
        return false;
      }
    } else {
      if (portable_attribute()->buffer()->data_size() <
          num_bytes * num_values) {
        return false;
      }
      if (in_buffer->remaining_size() <
          static_cast<int64_t>(num_bytes) * static_cast<int64_t>(num_values)) {
        return false;
      }
      for (size_t i = 0; i < num_values; ++i) {
        if (!in_buffer->Decode(portable_attribute_data + i, num_bytes)) {
          return false;
        }
      }
    }
  }

  if (num_values > 0 && (prediction_scheme_ == nullptr ||
                         !prediction_scheme_->AreCorrectionsPositive())) {
    // Convert the values back to the original signed format.
    ConvertSymbolsToSignedInts(
        reinterpret_cast<const uint32_t *>(portable_attribute_data),
        static_cast<int>(num_values), portable_attribute_data);
  }

  // If the data was encoded with a prediction scheme, we must revert it.
  if (prediction_scheme_) {
    if (!prediction_scheme_->DecodePredictionData(in_buffer)) {
      return false;
    }

    if (num_values > 0) {
      if (!prediction_scheme_->ComputeOriginalValues(
              portable_attribute_data, portable_attribute_data,
              static_cast<int>(num_values), num_components, point_ids.data())) {
        return false;
      }
    }
  }
  return true;
}